

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyDefinition::ParseValue(PropertyDefinition *this,Property *property,String *value)

{
  pointer pPVar1;
  long *plVar2;
  char cVar3;
  ulong uVar4;
  undefined4 uVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  
  lVar6 = 8;
  lVar8 = 0x38;
  uVar7 = 0;
  do {
    pPVar1 = (this->parsers).
             super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->parsers).
                   super__Vector_base<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x38;
    if (uVar4 <= uVar7) {
      lVar8 = 0x28;
      uVar5 = 0;
LAB_002ae207:
      *(undefined4 *)((property->value).data + lVar8 + -8) = uVar5;
      return uVar7 < uVar4;
    }
    plVar2 = *(long **)((long)pPVar1 + lVar6 + -8);
    cVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,property,value,(long)&pPVar1->parser + lVar6);
    if (cVar3 != '\0') {
      property->definition = this;
      uVar5 = (undefined4)uVar7;
      goto LAB_002ae207;
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x38;
  } while( true );
}

Assistant:

bool PropertyDefinition::ParseValue(Property& property, const String& value) const
{
	for (size_t i = 0; i < parsers.size(); i++)
	{
		if (parsers[i].parser->ParseValue(property, value, parsers[i].parameters))
		{
			property.definition = this;
			property.parser_index = (int)i;
			return true;
		}
	}

	property.unit = Unit::UNKNOWN;
	return false;
}